

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int uv__async_spin(uv_async_t *handle)

{
  int iVar1;
  int rc;
  uv_async_t *handle_local;
  
  while( true ) {
    iVar1 = cmpxchgi(&handle->pending,2,0);
    if (iVar1 != 1) break;
    cpu_relax();
  }
  return iVar1;
}

Assistant:

static int uv__async_spin(uv_async_t* handle) {
  int rc;

  for (;;) {
    /* rc=0 -- handle is not pending.
     * rc=1 -- handle is pending, other thread is still working with it.
     * rc=2 -- handle is pending, other thread is done.
     */
    rc = cmpxchgi(&handle->pending, 2, 0);

    if (rc != 1)
      return rc;

    /* Other thread is busy with this handle, spin until it's done. */
    cpu_relax();
  }
}